

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

Fad<long_double> * __thiscall
TPZMatrix<Fad<long_double>_>::ConditionNumber
          (Fad<long_double> *__return_storage_ptr__,TPZMatrix<Fad<long_double>_> *this,int p,
          int64_t numiter,REAL tol)

{
  int iVar1;
  ostream *poVar2;
  Fad<long_double> invnorm;
  Fad<long_double> thisnorm;
  TPZFMatrix<Fad<long_double>_> Inv;
  Fad<long_double> local_128;
  Fad<long_double> local_f8;
  FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> local_c8;
  TPZFMatrix<Fad<long_double>_> local_b8;
  
  TPZFMatrix<Fad<long_double>_>::TPZFMatrix(&local_b8);
  MatrixNorm(&local_f8,this,p,numiter,tol);
  iVar1 = Inverse(this,&local_b8,ENoDecompose);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "TVar TPZMatrix<Fad<long double>>::ConditionNumber(int, int64_t, REAL) [T = Fad<long double>]"
                            );
    poVar2 = std::operator<<(poVar2," - it was not possible to compute the inverse matrix.");
    std::endl<char,std::char_traits<char>>(poVar2);
    __return_storage_ptr__->val_ = (longdouble)0;
    (__return_storage_ptr__->dx_).num_elts = 0;
    (__return_storage_ptr__->dx_).ptr_to_data = (longdouble *)0x0;
    *(undefined8 *)&__return_storage_ptr__->defaultVal = 0;
    *(undefined2 *)((long)&__return_storage_ptr__->defaultVal + 8) = 0;
  }
  else {
    MatrixNorm(&local_128,&local_b8.super_TPZMatrix<Fad<long_double>_>,p,numiter,tol);
    local_c8.fadexpr_.left_ = &local_f8;
    local_c8.fadexpr_.right_ = &local_128;
    Fad<long_double>::Fad<FadBinaryMul<Fad<long_double>,Fad<long_double>>>
              (__return_storage_ptr__,&local_c8);
    Fad<long_double>::~Fad(&local_128);
  }
  Fad<long_double>::~Fad(&local_f8);
  TPZFMatrix<Fad<long_double>_>::~TPZFMatrix(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

TVar TPZMatrix<TVar>::ConditionNumber(int p, int64_t numiter, REAL tol){
	int64_t localnumiter = numiter;
	REAL localtol = tol;
	TPZFMatrix<TVar> Inv;
	TVar thisnorm = this->MatrixNorm(p, localnumiter, localtol);
	if (!this->Inverse(Inv,ENoDecompose)){
		PZError << __PRETTY_FUNCTION__ << " - it was not possible to compute the inverse matrix." << std:: endl;
		return 0.;
	}
	TVar invnorm = Inv.MatrixNorm(p, numiter, tol);
	return thisnorm * invnorm;
}